

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_node_set_raw * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_node_set
          (xpath_node_set_raw *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack,nodeset_eval_t eval)

{
  byte bVar1;
  xml_node_struct *pxVar2;
  xml_attribute_struct *pxVar3;
  type_t type;
  uint *puVar4;
  xpath_node_set_raw *extraout_RAX;
  xpath_node_set_raw *extraout_RAX_00;
  xpath_node_set_raw *extraout_RAX_01;
  xpath_node_set_raw *extraout_RAX_02;
  xpath_node_set_raw *pxVar5;
  xpath_variable *pxVar6;
  bool once;
  xpath_allocator_capture cr;
  xpath_stack swapped_stack;
  xpath_node_set_raw rs;
  xpath_allocator_capture local_78;
  xpath_stack local_58;
  xpath_node_set_raw local_48;
  
  bVar1 = this->_type;
  puVar4 = &switchD_0012ac2c::switchdataD_001347d0;
  switch(bVar1) {
  case 0xf:
    local_78._target = stack->temp;
    local_78._state._root = (local_78._target)->_root;
    local_78._state._root_size = (local_78._target)->_root_size;
    local_78._state._error = (local_78._target)->_error;
    local_58.temp = stack->result;
    local_58.result = local_78._target;
    eval_node_set(__return_storage_ptr__,this->_left,c,stack,eval);
    eval_node_set(&local_48,this->_right,c,&local_58,eval);
    __return_storage_ptr__->_type = type_unsorted;
    xpath_node_set_raw::append(__return_storage_ptr__,local_48._begin,local_48._end,stack->result);
    xpath_node_set_raw::remove_duplicates(__return_storage_ptr__,stack->temp);
    xpath_allocator_capture::~xpath_allocator_capture(&local_78);
    return extraout_RAX;
  case 0x11:
    eval_node_set(__return_storage_ptr__,this->_left,c,stack,(uint)(this->_test == '\x03') * 2);
    type = __return_storage_ptr__->_type;
    if (this->_test != '\x01') {
      type = xpath_sort(__return_storage_ptr__->_begin,__return_storage_ptr__->_end,type,false);
      __return_storage_ptr__->_type = type;
    }
    once = eval == nodeset_eval_any;
    if (type == type_sorted) {
      once = eval != nodeset_eval_all;
    }
    apply_predicate(this,__return_storage_ptr__,0,stack,once);
    return extraout_RAX_02;
  case 0x14:
    if (this->_rettype == '\x01') {
      pxVar6 = (xpath_variable *)&(anonymous_namespace)::dummy_node_set;
      if (((this->_data).variable)->_type == xpath_type_node_set) {
        pxVar6 = (this->_data).variable + 1;
      }
      __return_storage_ptr__->_begin = (xpath_node *)0x0;
      __return_storage_ptr__->_end = (xpath_node *)0x0;
      __return_storage_ptr__->_eos = (xpath_node *)0x0;
      __return_storage_ptr__->_type = pxVar6->_type;
      xpath_node_set_raw::append
                (__return_storage_ptr__,(xpath_node *)pxVar6[1]._next,*(xpath_node **)(pxVar6 + 2),
                 stack->result);
      return extraout_RAX_01;
    }
  case 0x10:
  case 0x12:
  case 0x13:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
switchD_0012ac2c_caseD_10:
    __return_storage_ptr__->_type = type_unsorted;
    __return_storage_ptr__->_begin = (xpath_node *)0x0;
    __return_storage_ptr__->_end = (xpath_node *)0x0;
    __return_storage_ptr__->_eos = (xpath_node *)0x0;
    return (xpath_node_set_raw *)puVar4;
  }
  if (bVar1 == 0x38) {
    pxVar5 = (xpath_node_set_raw *)(ulong)(byte)this->_axis;
    puVar4 = (uint *)pxVar5;
    if (pxVar5 < (xpath_node_set_raw *)0xd) {
      puVar4 = (uint *)((long)&switchD_0012ae1f::switchdataD_001347f8 +
                       (long)(int)(&switchD_0012ae1f::switchdataD_001347f8)[(long)pxVar5]);
      switch(pxVar5) {
      case (xpath_node_set_raw *)0x0:
        pxVar5 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)0>_>
                           (__return_storage_ptr__,this,c,stack,eval);
        return pxVar5;
      case (xpath_node_set_raw *)0x1:
        pxVar5 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
                           (__return_storage_ptr__,this,c,stack,eval);
        return pxVar5;
      case (xpath_node_set_raw *)0x2:
        pxVar5 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)2>_>
                           (__return_storage_ptr__,this,c,stack,eval);
        return pxVar5;
      case (xpath_node_set_raw *)0x3:
        pxVar5 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)3>_>
                           (__return_storage_ptr__,this,c,stack,eval);
        return pxVar5;
      case (xpath_node_set_raw *)0x4:
        pxVar5 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)4>_>
                           (__return_storage_ptr__,this,c,stack,eval);
        return pxVar5;
      case (xpath_node_set_raw *)0x5:
        pxVar5 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
                           (__return_storage_ptr__,this,c,stack,eval);
        return pxVar5;
      case (xpath_node_set_raw *)0x6:
        pxVar5 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
                           (__return_storage_ptr__,this,c,stack,eval);
        return pxVar5;
      case (xpath_node_set_raw *)0x7:
        pxVar5 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)7>_>
                           (__return_storage_ptr__,this,c,stack,eval);
        return pxVar5;
      case (xpath_node_set_raw *)0x9:
        pxVar5 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)9>_>
                           (__return_storage_ptr__,this,c,stack,eval);
        return pxVar5;
      case (xpath_node_set_raw *)0xa:
        pxVar5 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)10>_>
                           (__return_storage_ptr__,this,c,stack,eval);
        return pxVar5;
      case (xpath_node_set_raw *)0xb:
        pxVar5 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)11>_>
                           (__return_storage_ptr__,this,c,stack,eval);
        return pxVar5;
      case (xpath_node_set_raw *)0xc:
        pxVar5 = step_do<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)12>_>
                           (__return_storage_ptr__,this,c,stack,eval);
        return pxVar5;
      }
    }
    goto switchD_0012ac2c_caseD_10;
  }
  puVar4 = (uint *)(ulong)bVar1;
  if (bVar1 != 0x39) goto switchD_0012ac2c_caseD_10;
  __return_storage_ptr__->_begin = (xpath_node *)0x0;
  __return_storage_ptr__->_end = (xpath_node *)0x0;
  __return_storage_ptr__->_eos = (xpath_node *)0x0;
  __return_storage_ptr__->_type = type_sorted;
  pxVar2 = (c->n)._node._root;
  pxVar3 = (c->n)._attribute._attr;
  if (pxVar2 == (xml_node_struct *)0x0 || pxVar3 != (xml_attribute_struct *)0x0) {
    if (pxVar3 == (xml_attribute_struct *)0x0) {
      return (xpath_node_set_raw *)pxVar2;
    }
    if (pxVar2 == (xml_node_struct *)0x0) {
      local_78._target = (xpath_allocator *)0x0;
      goto LAB_0012ad1f;
    }
  }
  local_78._target = (xpath_allocator *)(*(long *)((long)pxVar2 - (pxVar2->header >> 8)) + -0x40);
LAB_0012ad1f:
  local_78._state._root = (xpath_memory_block *)0x0;
  xpath_node_set_raw::push_back_grow(__return_storage_ptr__,(xpath_node *)&local_78,stack->result);
  return extraout_RAX_00;
}

Assistant:

xpath_node_set_raw eval_node_set(const xpath_context& c, const xpath_stack& stack, nodeset_eval_t eval)
		{
			switch (_type)
			{
			case ast_op_union:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_node_set_raw ls = _left->eval_node_set(c, stack, eval);
				xpath_node_set_raw rs = _right->eval_node_set(c, swapped_stack, eval);

				// we can optimize merging two sorted sets, but this is a very rare operation, so don't bother
				ls.set_type(xpath_node_set::type_unsorted);

				ls.append(rs.begin(), rs.end(), stack.result);
				ls.remove_duplicates(stack.temp);

				return ls;
			}

			case ast_filter:
			{
				xpath_node_set_raw set = _left->eval_node_set(c, stack, _test == predicate_constant_one ? nodeset_eval_first : nodeset_eval_all);

				// either expression is a number or it contains position() call; sort by document order
				if (_test != predicate_posinv) set.sort_do();

				bool once = eval_once(set.type(), eval);

				apply_predicate(set, 0, stack, once);

				return set;
			}

			case ast_func_id:
				return xpath_node_set_raw();

			case ast_step:
			{
				switch (_axis)
				{
				case axis_ancestor:
					return step_do(c, stack, eval, axis_to_type<axis_ancestor>());

				case axis_ancestor_or_self:
					return step_do(c, stack, eval, axis_to_type<axis_ancestor_or_self>());

				case axis_attribute:
					return step_do(c, stack, eval, axis_to_type<axis_attribute>());

				case axis_child:
					return step_do(c, stack, eval, axis_to_type<axis_child>());

				case axis_descendant:
					return step_do(c, stack, eval, axis_to_type<axis_descendant>());

				case axis_descendant_or_self:
					return step_do(c, stack, eval, axis_to_type<axis_descendant_or_self>());

				case axis_following:
					return step_do(c, stack, eval, axis_to_type<axis_following>());

				case axis_following_sibling:
					return step_do(c, stack, eval, axis_to_type<axis_following_sibling>());

				case axis_namespace:
					// namespaced axis is not supported
					return xpath_node_set_raw();

				case axis_parent:
					return step_do(c, stack, eval, axis_to_type<axis_parent>());

				case axis_preceding:
					return step_do(c, stack, eval, axis_to_type<axis_preceding>());

				case axis_preceding_sibling:
					return step_do(c, stack, eval, axis_to_type<axis_preceding_sibling>());

				case axis_self:
					return step_do(c, stack, eval, axis_to_type<axis_self>());

				default:
					assert(false && "Unknown axis"); // unreachable
					return xpath_node_set_raw();
				}
			}

			case ast_step_root:
			{
				assert(!_right); // root step can't have any predicates

				xpath_node_set_raw ns;

				ns.set_type(xpath_node_set::type_sorted);

				if (c.n.node()) ns.push_back(c.n.node().root(), stack.result);
				else if (c.n.attribute()) ns.push_back(c.n.parent().root(), stack.result);

				return ns;
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_node_set)
				{
					const xpath_node_set& s = _data.variable->get_node_set();

					xpath_node_set_raw ns;

					ns.set_type(s.type());
					ns.append(s.begin(), s.end(), stack.result);

					return ns;
				}

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, but conversions to node set are invalid
			assert(false && "Wrong expression for return type node set"); // unreachable
			return xpath_node_set_raw();
		}